

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewWritableFile
          (PosixEnv *this,string *filename,WritableFile **result)

{
  int fd;
  PosixWritableFile *this_00;
  int *piVar1;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  fd = open((char *)*result,0x80241,0x1a4);
  if (fd < 0) {
    *in_RCX = 0;
    piVar1 = __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      PosixError((anon_unknown_1 *)this,(string *)result,*piVar1);
      return (Status)(char *)this;
    }
  }
  else {
    this_00 = (PosixWritableFile *)operator_new(0x10058);
    std::__cxx11::string::string
              ((string *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
    PosixWritableFile::PosixWritableFile(this_00,&local_50,fd);
    *in_RCX = this_00;
    std::__cxx11::string::~string((string *)&local_50);
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (Status)(char *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

Status NewWritableFile(const std::string& filename,
                         WritableFile** result) override {
    int fd = ::open(filename.c_str(),
                    O_TRUNC | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixWritableFile(filename, fd);
    return Status::OK();
  }